

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

Status __thiscall
leveldb::Version::Get(Version *this,ReadOptions *options,LookupKey *k,string *value,GetStats *stats)

{
  Status SVar1;
  bool bVar2;
  int iVar3;
  long *in_R9;
  Slice SVar4;
  Slice local_1b8;
  Slice local_1a8;
  Slice local_198;
  Status local_188;
  Slice local_180;
  Slice local_170;
  Status local_160;
  undefined4 local_154;
  undefined1 local_150 [16];
  Saver saver;
  FileMetaData *f_1;
  undefined1 auStack_110 [4];
  uint32_t i_1;
  size_t local_108;
  uint local_fc;
  iterator iStack_f8;
  uint32_t index;
  __normal_iterator<leveldb::FileMetaData_**,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
  local_f0;
  Slice local_e8;
  Slice local_d8;
  value_type local_c8;
  FileMetaData *f;
  uint32_t i;
  reference local_b0;
  FileMetaData **files;
  size_t num_files;
  value_type pFStack_98;
  int level;
  FileMetaData *tmp2;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> tmp;
  value_type pFStack_70;
  int last_file_read_level;
  FileMetaData *last_file_read;
  Status s;
  Comparator *ucmp;
  Slice user_key;
  Slice ikey;
  GetStats *stats_local;
  string *value_local;
  LookupKey *k_local;
  ReadOptions *options_local;
  Version *this_local;
  
  join_0x00000010_0x00000000_ = LookupKey::internal_key((LookupKey *)value);
  _ucmp = LookupKey::user_key((LookupKey *)value);
  s.state_ = (char *)InternalKeyComparator::user_comparator
                               ((InternalKeyComparator *)(*(long *)options + 0x38));
  Status::Status((Status *)&last_file_read);
  *in_R9 = 0;
  *(undefined4 *)(in_R9 + 1) = 0xffffffff;
  pFStack_70 = (value_type)0x0;
  tmp.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = -1;
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::vector
            ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)&tmp2);
  num_files._4_4_ = 0;
  do {
    if (6 < num_files._4_4_) {
      Slice::Slice(&local_1a8);
      Slice::Slice(&local_1b8);
      Status::NotFound((Status *)this,&local_1a8,&local_1b8);
LAB_00110f09:
      local_154 = 1;
      std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::~vector
                ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)&tmp2)
      ;
      Status::~Status((Status *)&last_file_read);
      return (Status)(char *)this;
    }
    files = (FileMetaData **)
            std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                      ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                       ((long)options + (long)num_files._4_4_ * 0x18 + 0x20));
    if (files != (FileMetaData **)0x0) {
      local_b0 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                 operator[]((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                             *)((long)options + (long)num_files._4_4_ * 0x18 + 0x20),0);
      if (num_files._4_4_ == 0) {
        std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::reserve
                  ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                   &tmp2,(size_type)files);
        for (f._0_4_ = 0; SVar1.state_ = s.state_, (FileMetaData **)(ulong)(uint)f < files;
            f._0_4_ = (uint)f + 1) {
          local_c8 = local_b0[(uint)f];
          SVar4 = InternalKey::user_key(&local_c8->smallest);
          local_d8 = SVar4;
          iVar3 = (**(code **)(*(long *)SVar1.state_ + 0x10))(SVar1.state_,&ucmp,&local_d8);
          SVar1 = s;
          bVar2 = false;
          if (-1 < iVar3) {
            SVar4 = InternalKey::user_key(&local_c8->largest);
            local_e8 = SVar4;
            iVar3 = (**(code **)(*(long *)SVar1.state_ + 0x10))(SVar1.state_,&ucmp,&local_e8);
            bVar2 = iVar3 < 1;
          }
          if (bVar2) {
            std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
            push_back((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                      &tmp2,&local_c8);
          }
        }
        bVar2 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                empty((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                      &tmp2);
        if (bVar2) goto LAB_00110eb3;
        local_f0._M_current =
             (FileMetaData **)
             std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::begin
                       ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *
                        )&tmp2);
        iStack_f8 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                    end((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *
                        )&tmp2);
        std::
        sort<__gnu_cxx::__normal_iterator<leveldb::FileMetaData**,std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>>,bool(*)(leveldb::FileMetaData*,leveldb::FileMetaData*)>
                  (local_f0,(__normal_iterator<leveldb::FileMetaData_**,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                             )iStack_f8._M_current,NewestFirst);
        local_b0 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                   operator[]((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                               *)&tmp2,0);
        files = (FileMetaData **)
                std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                          ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            *)&tmp2);
      }
      else {
        local_fc = FindFile((InternalKeyComparator *)(*(long *)options + 0x38),
                            (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                             *)((long)options + (long)num_files._4_4_ * 0x18 + 0x20),
                            (Slice *)&user_key.size_);
        SVar1 = s;
        if ((FileMetaData **)(ulong)local_fc < files) {
          pFStack_98 = local_b0[local_fc];
          SVar4 = InternalKey::user_key(&pFStack_98->smallest);
          _auStack_110 = SVar4;
          iVar3 = (**(code **)(*(long *)SVar1.state_ + 0x10))(SVar1.state_,&ucmp,auStack_110);
          if (-1 < iVar3) {
            local_b0 = &stack0xffffffffffffff68;
          }
          else {
            local_b0 = (reference)0x0;
          }
          files = (FileMetaData **)(ulong)(-1 < iVar3);
        }
        else {
          local_b0 = (reference)0x0;
          files = (FileMetaData **)0x0;
        }
      }
      f_1._4_4_ = 0;
      while ((FileMetaData **)(ulong)f_1._4_4_ < files) {
        if ((pFStack_70 != (value_type)0x0) && (*in_R9 == 0)) {
          *in_R9 = (long)pFStack_70;
          *(int *)(in_R9 + 1) =
               tmp.
               super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        }
        pFStack_70 = local_b0[f_1._4_4_];
        tmp.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = num_files._4_4_;
        saver.value = (string *)pFStack_70;
        anon_unknown_3::Saver::Saver((Saver *)(local_150 + 8));
        local_150._8_4_ = 0;
        saver._0_8_ = s.state_;
        saver.ucmp = ucmp;
        saver.user_key.data_ = user_key.data_;
        saver.user_key.size_ = (size_t)stats;
        TableCache::Get((TableCache *)local_150,*(ReadOptions **)(*(long *)options + 0x30),
                        (uint64_t)k,*(uint64_t *)(saver.value + 8),*(Slice **)(saver.value + 0x10),
                        &user_key.size_,(_func_void_void_ptr_Slice_ptr_Slice_ptr *)(local_150 + 8));
        Status::operator=((Status *)&last_file_read,(Status *)local_150);
        Status::~Status((Status *)local_150);
        bVar2 = Status::ok((Status *)&last_file_read);
        if (!bVar2) {
          Status::Status((Status *)this,(Status *)&last_file_read);
          goto LAB_00110f09;
        }
        switch(local_150._8_4_) {
        case 0:
        default:
          f_1._4_4_ = f_1._4_4_ + 1;
          break;
        case 1:
          Status::Status((Status *)this,(Status *)&last_file_read);
          goto LAB_00110f09;
        case 2:
          Slice::Slice(&local_170);
          Slice::Slice(&local_180);
          Status::NotFound(&local_160,&local_170,&local_180);
          Status::operator=((Status *)&last_file_read,&local_160);
          Status::~Status(&local_160);
          Status::Status((Status *)this,(Status *)&last_file_read);
          goto LAB_00110f09;
        case 3:
          Slice::Slice(&local_198,"corrupted key for ");
          Status::Corruption(&local_188,&local_198,(Slice *)&ucmp);
          Status::operator=((Status *)&last_file_read,&local_188);
          Status::~Status(&local_188);
          Status::Status((Status *)this,(Status *)&last_file_read);
          goto LAB_00110f09;
        }
      }
    }
LAB_00110eb3:
    num_files._4_4_ = num_files._4_4_ + 1;
  } while( true );
}

Assistant:

Status Version::Get(const ReadOptions& options, const LookupKey& k,
                    std::string* value, GetStats* stats) {
  Slice ikey = k.internal_key();
  Slice user_key = k.user_key();
  const Comparator* ucmp = vset_->icmp_.user_comparator();
  Status s;

  stats->seek_file = nullptr;
  stats->seek_file_level = -1;
  FileMetaData* last_file_read = nullptr;
  int last_file_read_level = -1;

  // We can search level-by-level since entries never hop across
  // levels.  Therefore we are guaranteed that if we find data
  // in a smaller level, later levels are irrelevant.
  std::vector<FileMetaData*> tmp;
  FileMetaData* tmp2;
  for (int level = 0; level < config::kNumLevels; level++) {
    size_t num_files = files_[level].size();
    if (num_files == 0) continue;

    // Get the list of files to search in this level
    FileMetaData* const* files = &files_[level][0];
    if (level == 0) {
      // Level-0 files may overlap each other.  Find all files that
      // overlap user_key and process them in order from newest to oldest.
      tmp.reserve(num_files);
      for (uint32_t i = 0; i < num_files; i++) {
        FileMetaData* f = files[i];
        if (ucmp->Compare(user_key, f->smallest.user_key()) >= 0 &&
            ucmp->Compare(user_key, f->largest.user_key()) <= 0) {
          tmp.push_back(f);
        }
      }
      if (tmp.empty()) continue;

      std::sort(tmp.begin(), tmp.end(), NewestFirst);
      files = &tmp[0];
      num_files = tmp.size();
    } else {
      // Binary search to find earliest index whose largest key >= ikey.
      uint32_t index = FindFile(vset_->icmp_, files_[level], ikey);
      if (index >= num_files) {
        files = nullptr;
        num_files = 0;
      } else {
        tmp2 = files[index];
        if (ucmp->Compare(user_key, tmp2->smallest.user_key()) < 0) {
          // All of "tmp2" is past any data for user_key
          files = nullptr;
          num_files = 0;
        } else {
          files = &tmp2;
          num_files = 1;
        }
      }
    }

    for (uint32_t i = 0; i < num_files; ++i) {
      if (last_file_read != nullptr && stats->seek_file == nullptr) {
        // We have had more than one seek for this read.  Charge the 1st file.
        stats->seek_file = last_file_read;
        stats->seek_file_level = last_file_read_level;
      }

      FileMetaData* f = files[i];
      last_file_read = f;
      last_file_read_level = level;

      Saver saver;
      saver.state = kNotFound;
      saver.ucmp = ucmp;
      saver.user_key = user_key;
      saver.value = value;
      s = vset_->table_cache_->Get(options, f->number, f->file_size, ikey,
                                   &saver, SaveValue);
      if (!s.ok()) {
        return s;
      }
      switch (saver.state) {
        case kNotFound:
          break;  // Keep searching in other files
        case kFound:
          return s;
        case kDeleted:
          s = Status::NotFound(Slice());  // Use empty error message for speed
          return s;
        case kCorrupt:
          s = Status::Corruption("corrupted key for ", user_key);
          return s;
      }
    }
  }

  return Status::NotFound(Slice());  // Use an empty error message for speed
}